

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O0

uint m68ki_read_8_fc(uint address,uint fc)

{
  uint uVar1;
  undefined4 local_c;
  uint fc_local;
  uint address_local;
  
  my_fc_handler(fc);
  local_c = address;
  if (m68ki_cpu.pmmu_enabled != 0) {
    local_c = pmmu_translate_addr(address);
  }
  uVar1 = m68k_read_memory_8(local_c & m68ki_cpu.address_mask);
  return uVar1;
}

Assistant:

static inline uint m68ki_read_8_fc(uint address, uint fc)
{
	(void)fc;
	m68ki_set_fc(fc); /* auto-disable (see m68kcpu.h) */

#if M68K_EMULATE_PMMU
	if (PMMU_ENABLED)
	    address = pmmu_translate_addr(address);
#endif

	return m68k_read_memory_8(ADDRESS_68K(address));
}